

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_help.c
# Opt level: O2

void test_help(void)

{
  wchar_t wVar1;
  int iVar2;
  char *__ptr;
  wchar_t value;
  char *__s1;
  size_t plen;
  
  value = L'\0';
  wVar1 = systemf("%s --help >help.stdout 2>help.stderr",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_help.c"
                      ,L'6',(long)wVar1,"r",0,"0",(void *)0x0);
  failure("--help should generate nothing to stderr.");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_help.c"
             ,L'8',"help.stderr");
  __ptr = slurpfile(&plen,"help.stdout");
  failure("Help output should be long enough.");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_help.c"
                   ,L'<',(uint)(5 < plen),"plen >= 6",(void *)0x0);
  failure("First line of help output should contain \'bsdtar\': %s",__ptr);
  __s1 = __ptr;
  do {
    if ((*__s1 == '\0') || (*__s1 == '\n')) goto LAB_00109e50;
    iVar2 = bcmp(__s1,"bsdtar",6);
    __s1 = __s1 + 1;
  } while (iVar2 != 0);
  value = L'\x01';
LAB_00109e50:
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_help.c"
                   ,L'>',value,"in_first_line(p, \"bsdtar\")",(void *)0x0);
  free(__ptr);
  wVar1 = systemf("%s -h >h.stdout 2>h.stderr",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_help.c"
                      ,L'G',(long)wVar1,"r",0,"0",(void *)0x0);
  failure("-h should generate nothing to stderr.");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_help.c"
             ,L'I',"h.stderr");
  failure("stdout should be same for -h and --help");
  assertion_equal_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_help.c"
             ,L'K',"h.stdout","help.stdout");
  wVar1 = systemf("%s -W help >Whelp.stdout 2>Whelp.stderr",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_help.c"
                      ,L'O',(long)wVar1,"r",0,"0",(void *)0x0);
  failure("-W help should generate nothing to stderr.");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_help.c"
             ,L'Q',"Whelp.stderr");
  failure("stdout should be same for -W help and --help");
  assertion_equal_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_help.c"
             ,L'S',"Whelp.stdout","help.stdout");
  return;
}

Assistant:

DEFINE_TEST(test_help)
{
	int r;
	char *p;
	size_t plen;

	/* Exercise --help option. */
	r = systemf("%s --help >help.stdout 2>help.stderr", testprog);
	assertEqualInt(r, 0);
	failure("--help should generate nothing to stderr.");
	assertEmptyFile("help.stderr");
	/* Help message should start with name of program. */
	p = slurpfile(&plen, "help.stdout");
	failure("Help output should be long enough.");
	assert(plen >= 6);
	failure("First line of help output should contain 'bsdtar': %s", p);
	assert(in_first_line(p, "bsdtar"));
	/*
	 * TODO: Extend this check to further verify that --help output
	 * looks approximately right.
	 */
	free(p);

	/* -h option should generate the same output. */
	r = systemf("%s -h >h.stdout 2>h.stderr", testprog);
	assertEqualInt(r, 0);
	failure("-h should generate nothing to stderr.");
	assertEmptyFile("h.stderr");
	failure("stdout should be same for -h and --help");
	assertEqualFile("h.stdout", "help.stdout");

	/* -W help should be another synonym. */
	r = systemf("%s -W help >Whelp.stdout 2>Whelp.stderr", testprog);
	assertEqualInt(r, 0);
	failure("-W help should generate nothing to stderr.");
	assertEmptyFile("Whelp.stderr");
	failure("stdout should be same for -W help and --help");
	assertEqualFile("Whelp.stdout", "help.stdout");
}